

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

void __thiscall
Enterprise::ConcreteMachine<false,false>::page<1ul>
          (ConcreteMachine<false,false> *this,uint8_t offset)

{
  size_type sVar1;
  reference read;
  reference pvVar2;
  reference read_00;
  reference read_01;
  reference write;
  size_t address;
  size_type ram_floor;
  uint8_t offset_local;
  ConcreteMachine<false,_false> *this_local;
  
  this[0x60169] = (ConcreteMachine<false,false>)offset;
  sVar1 = std::array<unsigned_char,_65536UL>::size
                    ((array<unsigned_char,_65536UL> *)(this + 0x40120));
  if ((ulong)offset < sVar1 >> 0xe) {
    read = std::array<unsigned_char,_65536UL>::operator[]
                     ((array<unsigned_char,_65536UL> *)(this + 0x40120),
                      (long)(int)((uint)offset << 0xe));
    page<1ul>(this,read,(uint8_t *)0x0);
    this[0x60171] = (ConcreteMachine<false,false>)0x0;
  }
  else if ((offset < 0x10) ||
          (sVar1 = std::array<unsigned_char,_16384UL>::size
                             ((array<unsigned_char,_16384UL> *)(this + 0x50120)),
          (sVar1 >> 0xe) + 0x10 <= (ulong)offset)) {
    if ((offset < 0x20) ||
       (sVar1 = std::array<unsigned_char,_16384UL>::size
                          ((array<unsigned_char,_16384UL> *)(this + 0x54120)),
       (sVar1 >> 0xe) + 0x20 <= (ulong)offset)) {
      if ((offset < 0x30) ||
         (sVar1 = std::array<unsigned_char,_32768UL>::size
                            ((array<unsigned_char,_32768UL> *)(this + 0x58120)),
         (sVar1 >> 0xe) + 0x30 <= (ulong)offset)) {
        if (offset < (byte)this[0x60120]) {
          page<1ul>(this,(uint8_t *)0x0,(uint8_t *)0x0);
        }
        else {
          sVar1 = std::array<unsigned_char,_262144UL>::size
                            ((array<unsigned_char,_262144UL> *)(this + 0x120));
          sVar1 = (long)(int)((uint)offset << 0xe) - (0x400000 - sVar1);
          this[0x60171] = (ConcreteMachine<false,false>)(0xfb < offset);
          read_01 = std::array<unsigned_char,_262144UL>::operator[]
                              ((array<unsigned_char,_262144UL> *)(this + 0x120),sVar1);
          write = std::array<unsigned_char,_262144UL>::operator[]
                            ((array<unsigned_char,_262144UL> *)(this + 0x120),sVar1);
          page<1ul>(this,read_01,write);
        }
      }
      else {
        read_00 = std::array<unsigned_char,_32768UL>::operator[]
                            ((array<unsigned_char,_32768UL> *)(this + 0x58120),
                             (long)(int)((offset - 0x30) * 0x4000));
        page<1ul>(this,read_00,(uint8_t *)0x0);
        this[0x60171] = (ConcreteMachine<false,false>)0x0;
      }
    }
    else {
      pvVar2 = std::array<unsigned_char,_16384UL>::operator[]
                         ((array<unsigned_char,_16384UL> *)(this + 0x54120),
                          (long)(int)((offset - 0x20) * 0x4000));
      page<1ul>(this,pvVar2,(uint8_t *)0x0);
      this[0x60171] = (ConcreteMachine<false,false>)0x0;
    }
  }
  else {
    pvVar2 = std::array<unsigned_char,_16384UL>::operator[]
                       ((array<unsigned_char,_16384UL> *)(this + 0x50120),
                        (long)(int)((offset - 0x10) * 0x4000));
    page<1ul>(this,pvVar2,(uint8_t *)0x0);
    this[0x60171] = (ConcreteMachine<false,false>)0x0;
  }
  return;
}

Assistant:

void page(uint8_t offset) {
			pages_[slot] = offset;

#define Map(location, source)												\
	if(offset >= location && offset < location + source.size() / 0x4000) {	\
		page<slot>(&source[(offset - location) * 0x4000], nullptr);			\
		is_video_[slot] = false;											\
		return;																\
	}

			Map(0, exos_);
			Map(16, basic_);
			Map(32, exdos_rom_);
			Map(48, epdos_rom_);

#undef Map

			// Of whatever size of RAM I've declared above, use only the final portion.
			// This correlated with Nick always having been handed the final 64kb and,
			// at least while the RAM is the first thing declared above, does a little
			// to benefit data locality. Albeit not in a useful sense.
			if(offset >= min_ram_slot_) {
				const auto ram_floor = 4194304 - ram_.size();
				const size_t address = offset * 0x4000 - ram_floor;
				is_video_[slot] = offset >= 0xfc;	// TODO: this hard-codes a 64kb video assumption.
				page<slot>(&ram_[address], &ram_[address]);
				return;
			}

			page<slot>(nullptr, nullptr);
		}